

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O2

void __thiscall Packet::respondToGet(Packet *this,socket *socket,FlaggedValue *fv,bool found)

{
  uint uVar1;
  undefined7 in_register_00000009;
  uchar res [28];
  undefined8 uStack_48;
  uint local_40;
  uint local_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  uint uStack_30;
  const_buffers_1 local_20;
  
  local_20.super_const_buffer.data_ = &uStack_48;
  uStack_38 = 0;
  uStack_48 = 0x400000081;
  uVar1 = (*(int *)&(fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish -
          *(int *)&(fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start) + 4;
  local_40 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 * 0x1000000;
  uVar1 = this->opaque;
  local_3c = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = fv->flags;
  _uStack_34 = CONCAT44(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                        uVar1 << 0x18,0x1000000);
  if ((int)CONCAT71(in_register_00000009,found) == 0) {
    uStack_48 = 0x100000400000081;
  }
  local_20.super_const_buffer.size_ = 0x1c;
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::mutable_buffers_1>
            (socket,(mutable_buffers_1 *)&local_20,(type *)0x0);
  local_20.super_const_buffer.data_ =
       (fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_20.super_const_buffer.size_ =
       (long)(fv->value).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)local_20.super_const_buffer.data_;
  if (local_20.super_const_buffer.size_ == 0) {
    local_20.super_const_buffer.data_ = (pointer)0x0;
  }
  boost::asio::
  write<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>,boost::asio::const_buffers_1>
            (socket,&local_20,(type *)0x0);
  return;
}

Assistant:

void Packet::respondToGet(socket& socket, const FlaggedValue& fv, bool found) {
  unsigned char res[28] = { 0x81, 0x00, 0x00, 0x00, 0x04, 0x00, 0x00,
                            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
                            0x00, 0x00, 0x01, 0x00, 0x00, 0x00, 0x00 };
  writeUInt32LE(&res[8], fv.value.size() + 4);
  writeUInt32LE(&res[12], opaque);
  writeUInt32LE(&res[24], fv.flags);
  // Section 4.1:
  // If the status code of a response packet is non-nil, the body of the packet
  // will contain a textual error message.
  if (!found) {
    res[7] = 0x01;
  }
  try {
    boost::asio::write(socket, boost::asio::buffer(res));
    boost::asio::write(socket, boost::asio::buffer(fv.value));
  } catch (std::exception& e) {
    std::cerr << e.what() << std::endl;
  }
}